

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall
spatial_region::fill_cell_by_particles
          (spatial_region *this,double cmr,int_vector3d *a,int_vector3d *b,double n,double ux0,
          double uy0,double dsplmt,double T)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  cellp *pcVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined8 uVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  particle *p;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 in_XMM0_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 in_XMM3_Qb;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_register_00001348 [56];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined8 in_XMM10_Qb;
  int local_130;
  int local_12c;
  double local_98;
  undefined8 uStack_90;
  double local_58;
  double dStack_50;
  undefined1 auVar35 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auVar52._8_56_ = in_register_00001348;
  auVar52._0_8_ = T;
  iVar17 = b->i;
  if (0 < iVar17) {
    auVar18._0_8_ = 0.5 / (double)b->j;
    auVar18._8_8_ = 0;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = 0.5 / (double)iVar17 + dsplmt;
    auVar25 = vunpcklpd_avx(auVar25,auVar18);
    iVar7 = b->k;
    dVar9 = (1.0 / (double)(b->j * iVar17 * iVar7)) * n;
    auVar50._8_8_ = 0x8000000000000000;
    auVar50._0_8_ = 0x8000000000000000;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar9;
    auVar18 = vxorpd_avx512vl(auVar46,auVar50);
    auVar50 = ZEXT816(0);
    auVar11._8_8_ = in_XMM0_Qb;
    auVar11._0_8_ = cmr;
    uVar13 = vcmpsd_avx512f(auVar11,auVar50,1);
    bVar14 = (bool)((byte)uVar13 & 1);
    uVar13 = vcmppd_avx512vl(auVar11,auVar50,4);
    uVar12 = vcmppd_avx512vl(auVar50,auVar52._0_16_,4);
    auVar19._8_8_ = in_XMM3_Qb;
    auVar19._0_8_ = uy0;
    auVar29._8_8_ = in_XMM2_Qb;
    auVar29._0_8_ = ux0;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uy0 * uy0;
    auVar46 = vfmadd231sd_fma(auVar47,auVar29,auVar29);
    auVar11 = vunpcklpd_avx(auVar29,auVar19);
    local_130 = 0;
    auVar50 = vsqrtsd_avx(auVar46,auVar46);
    auVar28._0_8_ = auVar50._0_8_;
    do {
      if (0 < b->j) {
        auVar26._0_8_ = (double)local_130;
        auVar26._8_8_ = in_XMM10_Qb;
        local_12c = 0;
        do {
          if (0 < b->k) {
            auVar27._0_8_ = (double)local_12c;
            auVar27._8_8_ = in_XMM10_Qb;
            auVar50 = vunpcklpd_avx(auVar26,auVar27);
            iVar17 = 0;
            do {
              p = new_particle(this);
              p->cmr = cmr;
              p->q = (double)((ulong)bVar14 * auVar18._0_8_ + (ulong)!bVar14 * (long)dVar9);
              uVar1 = a->i;
              uVar3 = a->j;
              auVar5._4_4_ = uVar3;
              auVar5._0_4_ = uVar1;
              auVar5._8_8_ = 0;
              auVar29 = vcvtdq2pd_avx(auVar5);
              local_58 = auVar25._0_8_;
              dStack_50 = auVar25._8_8_;
              uVar2 = b->i;
              uVar4 = b->j;
              auVar6._4_4_ = uVar4;
              auVar6._0_4_ = uVar2;
              auVar6._8_8_ = 0;
              auVar19 = vcvtdq2pd_avx(auVar6);
              auVar19 = vdivpd_avx(auVar50,auVar19);
              p->x = auVar29._0_8_ + local_58 + auVar19._0_8_;
              p->y = auVar29._8_8_ + dStack_50 + auVar19._8_8_;
              p->z = (double)a->k + 0.5 / (double)iVar7 + (double)iVar17 / (double)b->k;
              if ((((byte)uVar13 & 3) & uVar12 & 1) == 0) {
                p->ux = ux0;
                p->uy = uy0;
                auVar53._0_8_ = 0.0;
              }
              else {
                auVar28._8_8_ = 0;
                auVar29 = auVar28;
                if (auVar46._0_8_ < 0.0) {
                  auVar35._0_8_ = sqrt(auVar46._0_8_);
                  auVar35._8_56_ = extraout_var;
                  auVar29 = auVar35._0_16_;
                }
                auVar19 = vfmadd213sd_fma(auVar29,auVar29,ZEXT816(0x3ff0000000000000));
                if (auVar19._0_8_ < 0.0) {
                  auVar53._0_8_ = sqrt(auVar19._0_8_);
                }
                else {
                  auVar19 = vsqrtsd_avx(auVar19,auVar19);
                  auVar53._0_8_ = auVar19._0_8_;
                }
                do {
                  dVar20 = get_rand(this);
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = dVar20 * 5.0;
                  auVar19 = vfmadd213sd_fma(auVar39,auVar52._0_16_,ZEXT816(0x3ff0000000000000));
                  dVar22 = auVar19._0_8_;
                  dVar20 = get_rand(this);
                  auVar16._8_8_ = 0x8000000000000000;
                  auVar16._0_8_ = 0x8000000000000000;
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = dVar22 + -1.0;
                  auVar19 = vxorpd_avx512vl(auVar30,auVar16);
                  dVar21 = exp(auVar19._0_8_ / T);
                } while (dVar21 < dVar20);
                do {
                  auVar36._0_8_ = get_rand(this);
                  auVar36._8_56_ = extraout_var_00;
                  auVar19 = vfmadd213sd_fma(auVar36._0_16_,ZEXT816(0x4000000000000000),
                                            ZEXT816(0xbff0000000000000));
                  auVar40._0_8_ = auVar19._0_8_;
                  auVar37._0_8_ = get_rand(this);
                  auVar37._8_56_ = extraout_var_01;
                  auVar19 = vfmadd132sd_fma(auVar37._0_16_,ZEXT816(0xbff0000000000000),
                                            ZEXT816(0x4000000000000000));
                  dVar20 = auVar19._0_8_;
                  auVar38._0_8_ = get_rand(this);
                  auVar38._8_56_ = extraout_var_02;
                  auVar19 = vfmadd132sd_fma(auVar38._0_16_,ZEXT816(0xbff0000000000000),
                                            ZEXT816(0x4000000000000000));
                  auVar40._8_8_ = 0;
                  auVar31._8_8_ = 0;
                  auVar31._0_8_ = dVar20 * dVar20;
                  auVar47 = vfmadd231sd_fma(auVar31,auVar40,auVar40);
                  auVar47 = vfmadd231sd_fma(auVar47,auVar19,auVar19);
                  if (auVar47._0_8_ < 0.0) {
                    dVar21 = sqrt(auVar47._0_8_);
                  }
                  else {
                    auVar47 = vsqrtsd_avx(auVar47,auVar47);
                    dVar21 = auVar47._0_8_;
                  }
                } while ((1.0 < dVar21) || ((dVar21 == 0.0 && (!NAN(dVar21)))));
                dVar22 = 1.0 - 1.0 / (dVar22 * dVar22);
                if (dVar22 < 0.0) {
                  dVar22 = sqrt(dVar22);
                }
                else {
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = dVar22;
                  auVar47 = vsqrtsd_avx(auVar32,auVar32);
                  dVar22 = auVar47._0_8_;
                }
                local_98 = auVar29._0_8_;
                uStack_90 = auVar29._8_8_;
                auVar53._0_8_ = local_98 / auVar53._0_8_;
                auVar53._8_8_ = uStack_90;
                auVar41 = vfnmadd213sd_fma(auVar53,auVar53,ZEXT816(0x3ff0000000000000));
                if (auVar41._0_8_ < 0.0) {
                  dVar23 = sqrt(auVar41._0_8_);
                  auVar41._8_8_ = 0;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = auVar53._0_8_;
                }
                else {
                  auVar29 = vsqrtsd_avx(auVar41,auVar41);
                  dVar23 = auVar29._0_8_;
                  auVar54 = auVar53;
                }
                dVar10 = (auVar40._0_8_ / dVar21) * dVar22;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = dVar10;
                auVar29 = vfmadd213sd_fma(auVar54,auVar56,ZEXT816(0x3ff0000000000000));
                dVar15 = auVar29._0_8_;
                if (auVar41._0_8_ < 0.0) {
                  dVar24 = sqrt(auVar41._0_8_);
                }
                else {
                  auVar29 = vsqrtsd_avx(auVar41,auVar41);
                  dVar24 = auVar29._0_8_;
                  auVar53._0_8_ = auVar54._0_8_;
                }
                auVar48._0_8_ = ((dVar20 / dVar21) * dVar22 * dVar23) / dVar15;
                auVar48._8_8_ = 0;
                auVar55._0_8_ = ((auVar19._0_8_ / dVar21) * dVar22 * dVar24) / dVar15;
                auVar55._8_8_ = 0;
                auVar42._0_8_ = (dVar10 + auVar53._0_8_) / dVar15;
                auVar42._8_8_ = 0;
                auVar29 = vfnmadd213sd_fma(auVar42,auVar42,ZEXT816(0x3ff0000000000000));
                auVar29 = vfnmadd231sd_fma(auVar29,auVar48,auVar48);
                auVar29 = vfnmadd231sd_fma(auVar29,auVar55,auVar55);
                if (auVar29._0_8_ < 0.0) {
                  auVar53._0_8_ = sqrt(auVar29._0_8_);
                }
                else {
                  auVar29 = vsqrtsd_avx(auVar29,auVar29);
                  auVar53._0_8_ = auVar29._0_8_;
                }
                auVar53._0_8_ = 1.0 / auVar53._0_8_;
                auVar43._0_8_ = auVar42._0_8_ * auVar53._0_8_ * auVar11._0_8_;
                auVar43._8_8_ = auVar42._0_8_ * auVar53._0_8_ * auVar11._8_8_;
                auVar51._8_8_ = local_98;
                auVar51._0_8_ = local_98;
                auVar29 = vdivpd_avx(auVar43,auVar51);
                auVar19 = vshufpd_avx(auVar11,auVar11,1);
                auVar49._0_8_ = auVar48._0_8_ * auVar53._0_8_ * auVar19._0_8_;
                auVar49._8_8_ = auVar48._0_8_ * auVar53._0_8_ * auVar19._8_8_;
                auVar19 = vdivpd_avx(auVar49,auVar51);
                auVar29 = vaddsubpd_avx(auVar29,auVar19);
                p->ux = (double)auVar29._0_8_;
                p->uy = (double)auVar29._8_8_;
                auVar53._0_8_ = auVar55._0_8_ * auVar53._0_8_;
              }
              p->uz = auVar53._0_8_;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = p->ux;
              if ((cmr != 0.0) || (NAN(cmr))) {
                auVar29 = vfmadd213sd_fma(auVar33,auVar33,ZEXT816(0x3ff0000000000000));
                auVar44._8_8_ = 0;
                auVar44._0_8_ = p->uy;
                auVar29 = vfmadd213sd_fma(auVar44,auVar44,auVar29);
              }
              else {
                auVar45._8_8_ = 0;
                auVar45._0_8_ = p->uy * p->uy;
                auVar29 = vfmadd213sd_fma(auVar33,auVar33,auVar45);
              }
              auVar34._8_8_ = 0;
              auVar34._0_8_ = p->uz;
              auVar29 = vfmadd213sd_fma(auVar34,auVar34,auVar29);
              if (auVar29._0_8_ < 0.0) {
                auVar53._0_8_ = sqrt(auVar29._0_8_);
              }
              else {
                auVar29 = vsqrtsd_avx(auVar29,auVar29);
                auVar53._0_8_ = auVar29._0_8_;
              }
              p->g = auVar53._0_8_;
              p->chi = 0.0;
              p->trn = 0;
              place(this,p);
              iVar17 = iVar17 + 1;
            } while (iVar17 < b->k);
          }
          local_12c = local_12c + 1;
        } while (local_12c < b->j);
      }
      local_130 = local_130 + 1;
    } while (local_130 < b->i);
  }
  pcVar8 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
           super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
           super__Head_base<0UL,_cellp_***,_false>._M_head_impl[a->i][a->j];
  pcVar8[a->k].pl.start = pcVar8[a->k].pl.head;
  return;
}

Assistant:

void spatial_region::fill_cell_by_particles(double cmr, int_vector3d& a, int_vector3d& b, double n, double ux0, double uy0, double dsplmt, double T)
{
    // a = {i,j,k} - cell position, b = {xnpic,ynpic,znpic}, n - density
    double x0;
    double y0;
    double z0;
    double q0;
    particle* tmp_p;
    x0 = 0.5/b.i + dsplmt;
    y0 = 0.5/b.j;
    z0 = 0.5/b.k;
    q0 = 1/double(b.i*b.j*b.k)*n;
    if (cmr<0) q0 = -q0;
    for(int ip=0;ip<b.i;ip++)
    {
        for(int jp=0;jp<b.j;jp++)
        {
            for(int kp=0;kp<b.k;kp++)
            {
                tmp_p = new_particle();
                // initial conditions
                tmp_p->cmr = cmr;
                tmp_p->q = q0;
                tmp_p->x = x0 + double(a.i) + double(ip)/double(b.i);
                tmp_p->y = y0 + double(a.j) + double(jp)/double(b.j);
                tmp_p->z = z0 + double(a.k) + double(kp)/double(b.k);
                if ( T!=0 && cmr!=0 ){
                    double u0 = sqrt( ux0*ux0 + uy0*uy0 );
                    double v0 = u0 / sqrt( 1 + u0*u0 );
                    double a, b, c, r, gamma, v;
                    // gives gamma with approximately e^(-(x-1)/T) distribution
                    do {
                        gamma = 1 + get_rand() * 5 * T;
                    } while ( get_rand() > exp( -(gamma - 1) / T));
                    // gives random direction (uniform)
                    do {
                        a = 2*get_rand()-1;
                        b = 2*get_rand()-1;
                        c = 2*get_rand()-1;
                        r = sqrt( a*a + b*b + c*c );
                    } while ( r > 1 || r == 0);
                    a = a / r;
                    b = b / r;
                    c = c / r;
                    // (a, b, c) now is the random vector uniformly distributed on a unit
                    // sphere
                    v = sqrt(1 - 1 / (gamma * gamma));
                    a = v * a; // vx'
                    b = v * b; // vy'
                    c = v * c; // vz'
                    // Lorentz transformation to lab reference frame
                    b = b*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    c = c*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    a = ( a + v0 )/( 1 + a*v0 );
                    double g = 1/sqrt( 1 - a*a - b*b - c*c );
                    tmp_p->ux = a*g*ux0/u0 - b*g*uy0/u0;
                    tmp_p->uy = a*g*uy0/u0 + b*g*ux0/u0;
                    tmp_p->uz = c*g;
                } else {
                    tmp_p->ux = ux0;
                    tmp_p->uy = uy0;
                    tmp_p->uz = 0;
                }
                if (cmr!=0)
                    tmp_p->g = sqrt(1 + (*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                else
                    tmp_p->g = sqrt((*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                #ifndef QUILL_NOQED
                tmp_p->chi = 0;
                #endif
                tmp_p->trn = 0;
                place(*tmp_p);
            }
        }
    }
    cp[a.i][a.j][a.k].pl.start = cp[a.i][a.j][a.k].pl.head;
}